

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

int __thiscall smf::MidiFile::getSplitTrack(MidiFile *this,int track,int index)

{
  int iVar1;
  MidiEvent *pMVar2;
  int index_local;
  int track_local;
  MidiFile *this_local;
  
  iVar1 = hasSplitTracks(this);
  this_local._4_4_ = track;
  if (iVar1 == 0) {
    pMVar2 = getEvent(this,track,index);
    this_local._4_4_ = pMVar2->track;
  }
  return this_local._4_4_;
}

Assistant:

int MidiFile::getSplitTrack(int track, int index) const {
	if (hasSplitTracks()) {
		return track;
	} else {
		return getEvent(track, index).track;
	}
}